

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O1

Pipeline * __thiscall Pipeline::operator<<(Pipeline *this,long i)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint __len;
  ulong __val;
  string __str;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  
  __val = -i;
  if (0 < i) {
    __val = i;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_001315f0;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_001315f0;
      }
      if (uVar3 < 10000) goto LAB_001315f0;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_001315f0:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(i >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_50 - (i >> 0x3f)),__len,__val);
  (*this->_vptr_Pipeline[2])(this,local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return this;
}

Assistant:

Pipeline&
Pipeline::operator<<(long i)
{
    this->writeString(std::to_string(i));
    return *this;
}